

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O1

rtr_bgpsec *
rtr_bgpsec_new(uint8_t alg,uint8_t safi,uint16_t afi,uint32_t my_as,uint32_t target_as,
              rtr_bgpsec_nlri *nlri)

{
  long lVar1;
  rtr_bgpsec *prVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prVar2 = (rtr_bgpsec *)lrtr_malloc(0x28);
  if (prVar2 == (rtr_bgpsec *)0x0) {
    prVar2 = (rtr_bgpsec *)0x0;
  }
  else {
    prVar2->alg = alg;
    prVar2->safi = safi;
    prVar2->afi = afi;
    prVar2->my_as = my_as;
    prVar2->target_as = target_as;
    prVar2->nlri = nlri;
    prVar2->path_len = '\0';
    prVar2->sigs_len = 0;
    prVar2->sigs = (rtr_signature_seg *)0x0;
    prVar2->path = (rtr_secure_path_seg *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return prVar2;
  }
  __stack_chk_fail();
}

Assistant:

struct rtr_bgpsec *rtr_bgpsec_new(uint8_t alg, uint8_t safi, uint16_t afi, uint32_t my_as, uint32_t target_as,
				  struct rtr_bgpsec_nlri *nlri)
{
	struct rtr_bgpsec *bgpsec = lrtr_malloc(sizeof(struct rtr_bgpsec));

	if (!bgpsec)
		return NULL;

	bgpsec->alg = alg;
	bgpsec->safi = safi;
	bgpsec->afi = afi;
	bgpsec->my_as = my_as;
	bgpsec->target_as = target_as;
	bgpsec->nlri = nlri;
	bgpsec->path_len = 0;
	bgpsec->path = NULL;
	bgpsec->sigs_len = 0;
	bgpsec->sigs = NULL;

	return bgpsec;
}